

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_fmadd_df_mips64
               (CPUMIPSState_conflict5 *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t wt)

{
  int32_t *piVar1;
  float_status *pfVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  float32 fVar6;
  fpr_t *pfVar7;
  float64 fVar8;
  float_status *status;
  long lVar9;
  uintptr_t unaff_retaddr;
  wr_t wx;
  float64 local_48 [3];
  
  pfVar7 = (env->active_fpu).fpr + wd;
  lVar3 = (ulong)ws * 0x10 + 0x338;
  lVar4 = (ulong)wt * 0x10 + 0x338;
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  if (df == 2) {
    pfVar2 = &(env->active_tc).msa_fp_status;
    for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 4) {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar6 = float32_muladd_mips64
                        (*(float32 *)((long)(env->active_fpu).fpr + lVar9 + lVar3 + -0x338),
                         *(float32 *)((long)(env->active_fpu).fpr + lVar9 + lVar4 + -0x338),
                         *(float32 *)((long)pfVar7 + lVar9),0,pfVar2);
      *(float32 *)((long)local_48 + lVar9) = fVar6;
      uVar5 = update_msacsr(env,0,(uint)((fVar6 & 0x7f800000) == 0 && (fVar6 & 0x7fffffff) != 0));
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar5) != 0) {
        fVar6 = float32_default_nan_mips64(pfVar2);
        *(float32 *)((long)local_48 + lVar9) = fVar6 & 0xffffffc0 ^ 0x400000 | uVar5;
      }
    }
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x193e,
                    "void helper_msa_fmadd_df_mips64(CPUMIPSState *, uint32_t, uint32_t, uint32_t, uint32_t)"
                   );
    }
    pfVar2 = &(env->active_tc).msa_fp_status;
    for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 8) {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar8 = float64_muladd_mips64
                        (*(float64 *)((long)(env->active_fpu).fpr + lVar9 + lVar3 + -0x338),
                         *(float64 *)((long)(env->active_fpu).fpr + lVar9 + lVar4 + -0x338),
                         *(float64 *)((long)pfVar7 + lVar9),0,pfVar2);
      *(float64 *)((long)local_48 + lVar9) = fVar8;
      uVar5 = update_msacsr(env,0,(uint)((fVar8 & 0x7ff0000000000000) == 0 &&
                                        (fVar8 & 0x7fffffffffffffff) != 0));
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar5) != 0) {
        fVar8 = float64_default_nan_mips64(pfVar2);
        *(float64 *)((long)local_48 + lVar9) =
             (long)(int)uVar5 | fVar8 & 0xffffffffffffffc0 ^ 0x8000000000000;
      }
    }
  }
  check_msacsr_cause(env,unaff_retaddr);
  pfVar7->fd = local_48[0];
  *(float64 *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = local_48[1];
  return;
}

Assistant:

void helper_msa_fmadd_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
        uint32_t ws, uint32_t wt)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);
    uint32_t i;

    clear_msacsr_cause(env);

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            MSA_FLOAT_MULADD(pwx->w[i], pwd->w[i],
                           pws->w[i], pwt->w[i], 0, 32);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_MULADD(pwx->d[i], pwd->d[i],
                           pws->d[i], pwt->d[i], 0, 64);
        }
        break;
    default:
        assert(0);
    }

    check_msacsr_cause(env, GETPC());

    msa_move_v(pwd, pwx);
}